

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base32.cpp
# Opt level: O3

void __thiscall
Base32_UInt128Low64TwoUint64s_Test::TestBody(Base32_UInt128Low64TwoUint64s_Test *this)

{
  char *message;
  uint128 in_stack_ffffffffffffffb8;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string local_28;
  
  pstore::base32::convert<pstore::uint128>
            (&local_28,(base32 *)0xffffffffffffffff,in_stack_ffffffffffffffb8);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[14]>
            (local_38,"convert (v)","\"777777777777p\"",&local_28,(char (*) [14])"777777777777p");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_base32.cpp"
               ,0x8e,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if ((long *)local_28._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_28._M_dataplus._M_p + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST (Base32, UInt128Low64TwoUint64s) {
    using pstore::uint128;
    using pstore::base32::convert;
    uint128 v{0U, UINT64_C (0xffffffffffffffff)};
    EXPECT_EQ (convert (v), "777777777777p");
}